

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v5::anon_unknown_10::format_error_code
          (anon_unknown_10 *this,buffer *out,int error_code,string_view message)

{
  int value;
  type tVar1;
  size_t __n;
  uint32_t value_00;
  uint32_t n;
  writer w;
  
  internal::basic_buffer<char>::resize((basic_buffer<char> *)this,0);
  value_00 = (uint32_t)out;
  n = -value_00;
  if (0 < (int)value_00) {
    n = value_00;
  }
  value = internal::count_digits(n);
  tVar1 = internal::to_unsigned<int>(value);
  w.locale_.locale_ = (void *)0x0;
  __n = (((ulong)out & 0xffffffff) >> 0x1f) + (ulong)tVar1;
  w.out_.container = (basic_buffer<char> *)this;
  if (message.data_ <= (char *)(0x1ec - __n)) {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
              (&w,error_code,message.data_,__n);
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
              (&w,0x140050,(void *)0x2,__n);
  }
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (&w,0x140210,(void *)0x6,__n);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_decimal<int>(&w,value_00);
  return;
}

Assistant:

void format_error_code(internal::buffer &out, int error_code,
                       string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  typedef internal::int_traits<int>::main_type main_type;
  main_type abs_value = static_cast<main_type>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::to_unsigned(internal::count_digits(abs_value));
  writer w(out);
  if (message.size() <= inline_buffer_size - error_code_size) {
    w.write(message);
    w.write(SEP);
  }
  w.write(ERROR_STR);
  w.write(error_code);
  assert(out.size() <= inline_buffer_size);
}